

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_scanner_tokenAsString(sysbvm_context_t *context,size_t stringSize,uint8_t *string)

{
  sysbvm_tuple_t sVar1;
  ulong uVar2;
  uint8_t *puVar3;
  uint8_t uVar4;
  size_t stringSize_00;
  
  if (stringSize < 2) {
    sysbvm_error_assertionFailure
              (
              "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/scanner.c:109: assertion failure: stringSize >= 2"
              );
  }
  stringSize_00 = 0;
  if (stringSize != 2) {
    uVar2 = 0;
    do {
      stringSize_00 = stringSize_00 + 1;
      uVar2 = uVar2 + (string[uVar2 + 1] == '\\') + 1;
    } while (uVar2 < stringSize - 2);
  }
  sVar1 = sysbvm_string_createEmptyWithSize(context,stringSize_00);
  if (1 < stringSize - 1) {
    puVar3 = (uint8_t *)(sVar1 + 0x10);
    uVar2 = 1;
    do {
      uVar4 = string[uVar2];
      if (uVar4 == '\\') {
        uVar4 = string[uVar2 + 1];
        uVar2 = uVar2 + 1;
        if (uVar4 == 'n') {
          uVar4 = '\n';
        }
        else if (uVar4 == 't') {
          uVar4 = '\t';
        }
        else if (uVar4 == 'r') {
          uVar4 = '\r';
        }
      }
      *puVar3 = uVar4;
      puVar3 = puVar3 + 1;
      uVar2 = uVar2 + 1;
    } while (uVar2 < stringSize - 1);
  }
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_scanner_tokenAsString(sysbvm_context_t *context, size_t stringSize, const uint8_t *string)
{
    SYSBVM_ASSERT(stringSize >= 2);

    size_t requiredStringSize = countSizeRequiredForString(stringSize - 2, string + 1);
    sysbvm_tuple_t allocatedString = sysbvm_string_createEmptyWithSize(context, requiredStringSize);
    uint8_t *destination = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(allocatedString)->bytes;
    for(size_t i = 1; i < stringSize - 1; ++i)
    {
        uint8_t c = string[i];
        if(c == '\\')
        {
            ++i;
            c = string[i];
            switch(c)
            {
            case 't':
                *destination++ = '\t';
                break;
            case 'r':
                *destination++ = '\r';
                break;
            case 'n':
                *destination++ = '\n';
                break;
            default:
                *destination++ = c;
                break;
            }
        }
        else
        {
            *destination++ = c;
        }
    }

    return allocatedString;
}